

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::copytok(CTcTokenizer *this,CTcToken *dst,CTcToken *src)

{
  tc_toktyp_t typ;
  int iVar1;
  char *txt;
  size_t len;
  CTcToken *in_RDX;
  CTcToken *in_RSI;
  CTcTokenizer *in_RDI;
  CTcToken *this_00;
  char *in_stack_ffffffffffffffd8;
  
  memcpy(in_RSI,in_RDX,0x21);
  typ = CTcToken::gettyp(in_RDX);
  iVar1 = is_tok_safe(in_RDI,typ);
  if (iVar1 == 0) {
    this_00 = in_RSI;
    CTcToken::get_text(in_RSI);
    CTcToken::get_text_len(in_RSI);
    txt = store_source(in_RDI,in_stack_ffffffffffffffd8,(size_t)this_00);
    len = CTcToken::get_text_len(in_RSI);
    CTcToken::set_text(this_00,txt,len);
  }
  return;
}

Assistant:

void CTcTokenizer::copytok(CTcToken *dst, const CTcToken *src)
{
    /* start with an exact copy of the token */
    *dst = *src;

    /* if the token is a symbol, it already has a safe copy */
    if (is_tok_safe(src->gettyp()))
        return;

    /* save the token's text in permanent tokenizer memory */
    dst->set_text(store_source(dst->get_text(), dst->get_text_len()),
                  dst->get_text_len());
}